

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O0

void duckdb::SetVectorStringView(Vector *vector,idx_t size,ArrowArray *array,idx_t current_pos)

{
  bool bVar1;
  int32_t iVar2;
  string_t *psVar3;
  arrow_string_view_t *paVar4;
  long in_RCX;
  ArrowArray *in_RDX;
  ulong in_RSI;
  char *c_data;
  int32_t offset;
  uint buffer_index;
  uint length;
  idx_t row_idx;
  arrow_string_view_t *arrow_string;
  string_t *strings;
  idx_t in_stack_ffffffffffffff88;
  arrow_string_view_t *in_stack_ffffffffffffff90;
  char *local_68;
  char *in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  string_t *in_stack_ffffffffffffffb0;
  char *local_48;
  ulong local_38;
  
  psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x149f2b2);
  paVar4 = ArrowBufferData<duckdb::arrow_string_view_t>(in_RDX,1);
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    bVar1 = FlatVector::IsNull((Vector *)&in_stack_ffffffffffffff90->inlined,
                               in_stack_ffffffffffffff88);
    if (!bVar1) {
      iVar2 = arrow_string_view_t::Length((arrow_string_view_t *)&paVar4[in_RCX + local_38].inlined)
      ;
      UnsafeNumericCast<unsigned_int,int,void>(iVar2);
      bVar1 = arrow_string_view_t::IsInline((arrow_string_view_t *)0x149f341);
      if (bVar1) {
        arrow_string_view_t::GetInlineData(in_stack_ffffffffffffff90);
        string_t::string_t(in_stack_ffffffffffffffb0,
                           (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        *(string_t **)&psVar3[local_38].value = in_stack_ffffffffffffffb0;
        psVar3[local_38].value.pointer.ptr = local_48;
      }
      else {
        iVar2 = arrow_string_view_t::GetBufferIndex
                          ((arrow_string_view_t *)&paVar4[in_RCX + local_38].inlined);
        in_stack_ffffffffffffffac = UnsafeNumericCast<unsigned_int,int,void>(iVar2);
        in_stack_ffffffffffffffa8 =
             arrow_string_view_t::GetOffset
                       ((arrow_string_view_t *)&paVar4[in_RCX + local_38].inlined);
        in_stack_ffffffffffffffa0 =
             ArrowBufferData<char>(in_RDX,(ulong)(in_stack_ffffffffffffffac + 2));
        string_t::string_t(in_stack_ffffffffffffffb0,
                           (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        *(arrow_string_view_t **)&psVar3[local_38].value = in_stack_ffffffffffffff90;
        psVar3[local_38].value.pointer.ptr = local_68;
      }
    }
  }
  return;
}

Assistant:

static void SetVectorStringView(Vector &vector, idx_t size, ArrowArray &array, idx_t current_pos) {
	auto strings = FlatVector::GetData<string_t>(vector);
	auto arrow_string = ArrowBufferData<arrow_string_view_t>(array, 1) + current_pos;

	for (idx_t row_idx = 0; row_idx < size; row_idx++) {
		if (FlatVector::IsNull(vector, row_idx)) {
			continue;
		}
		auto length = UnsafeNumericCast<uint32_t>(arrow_string[row_idx].Length());
		if (arrow_string[row_idx].IsInline()) {
			//	This string is inlined
			//  | Bytes 0-3  | Bytes 4-15                            |
			//  |------------|---------------------------------------|
			//  | length     | data (padded with 0)                  |
			strings[row_idx] = string_t(arrow_string[row_idx].GetInlineData(), length);
		} else {
			//  This string is not inlined, we have to check a different buffer and offsets
			//  | Bytes 0-3  | Bytes 4-7  | Bytes 8-11 | Bytes 12-15 |
			//  |------------|------------|------------|-------------|
			//  | length     | prefix     | buf. index | offset      |
			auto buffer_index = UnsafeNumericCast<uint32_t>(arrow_string[row_idx].GetBufferIndex());
			int32_t offset = arrow_string[row_idx].GetOffset();
			D_ASSERT(array.n_buffers > 2 + buffer_index);
			auto c_data = ArrowBufferData<char>(array, 2 + buffer_index);
			strings[row_idx] = string_t(&c_data[offset], length);
		}
	}
}